

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall
CVmObject::set_index_val_ov
          (CVmObject *this,vm_val_t *new_container,vm_obj_id_t self,vm_val_t *index_val,
          vm_val_t *new_val)

{
  int iVar1;
  vm_val_t *pvVar2;
  vm_val_t *in_RCX;
  vm_obj_id_t in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  vm_val_t *in_R8;
  vm_val_t vself;
  int in_stack_00000030;
  int in_stack_00000050;
  vm_val_t local_38;
  vm_val_t *local_28;
  vm_val_t *local_20;
  vm_obj_id_t local_14;
  undefined8 *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  iVar1 = (**(code **)(*in_RDI + 0x140))(in_RDI,in_RSI,in_EDX,in_RCX,in_R8);
  if (iVar1 == 0) {
    vm_val_t::set_obj(&local_38,local_14);
    CVmStack::push(local_28);
    CVmStack::push(local_20);
    CVmRun::op_overload((CVmRun *)new_container,self,in_stack_00000030,index_val,new_val._6_2_,
                        (uint)new_val,in_stack_00000050);
    pvVar2 = CVmRun::get_r0();
    *local_10 = *(undefined8 *)pvVar2;
    *(anon_union_8_8_cb74652f_for_val *)(local_10 + 1) = pvVar2->val;
  }
  return;
}

Assistant:

void CVmObject::set_index_val_ov(VMG_ vm_val_t *new_container,
                                 vm_obj_id_t self,
                                 const vm_val_t *index_val,
                                 const vm_val_t *new_val)
{
    /* try the native indexing first */
    if (!set_index_val_q(vmg_ new_container, self, index_val, new_val))
    {
        /* no native indexing - try the operator[]= overload */
        vm_val_t vself;
        vself.set_obj(self);
        G_stk->push(new_val);
        G_stk->push(index_val);
        G_interpreter->op_overload(vmg_ 0, -1,
                                   &vself, G_predef->operator_setidx,
                                   2, VMERR_CANNOT_INDEX_TYPE);

        /* return the new container result from R0 */
        *new_container = *G_interpreter->get_r0();
    }
}